

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdhopt.c
# Opt level: O3

void mbedtls_ecdhopt_free(mbedtls_ecdhopt_context *ctx)

{
  if ((ctx != (mbedtls_ecdhopt_context *)0x0) && (ctx->curve != MBEDTLS_ECP_DP_CURVE25519)) {
    mbedtls_ecdh_free(&(ctx->ctx).ec);
    return;
  }
  return;
}

Assistant:

void mbedtls_ecdhopt_free( mbedtls_ecdhopt_context *ctx )
{
    if( ctx == NULL )
        return;

    switch( ctx->curve )
    {
        case MBEDTLS_ECP_DP_CURVE25519:
            break;
        default:
            mbedtls_ecdh_free( &ctx->ctx.ec );
    }
}